

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cpp
# Opt level: O2

bool __thiscall libcellml::Model::hasUnresolvedImports(Model *this)

{
  EntityImpl *pEVar1;
  bool bVar2;
  size_t sVar3;
  size_t index_1;
  size_t index;
  ulong uVar4;
  ComponentEntity local_38;
  
  bVar2 = false;
  for (uVar4 = 0;
      (!bVar2 &&
      (pEVar1 = (this->super_ComponentEntity).super_NamedEntity.super_ParentedEntity.super_Entity.
                mPimpl,
      uVar4 < (ulong)((long)(pEVar1[4].mId.field_2._M_allocated_capacity -
                            pEVar1[4].mId._M_string_length) >> 4))); uVar4 = uVar4 + 1) {
    units((Model *)&local_38,(size_t)this);
    bVar2 = ImportedEntity::isResolved
                      ((ImportedEntity *)
                       (local_38.super_NamedEntity.super_ParentedEntity.super_Entity._vptr_Entity +
                       2));
    bVar2 = !bVar2;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &local_38.super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl);
  }
  uVar4 = 0;
  while( true ) {
    sVar3 = ComponentEntity::componentCount(&this->super_ComponentEntity);
    if ((bVar2 != false) || (sVar3 <= uVar4)) break;
    ComponentEntity::component(&local_38,(size_t)this);
    bVar2 = ImportedEntity::isResolved
                      ((ImportedEntity *)
                       (local_38.super_NamedEntity.super_ParentedEntity.super_Entity._vptr_Entity +
                       2));
    bVar2 = !bVar2;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &local_38.super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl);
    uVar4 = uVar4 + 1;
  }
  return bVar2;
}

Assistant:

bool Model::hasUnresolvedImports() const
{
    bool unresolvedImports = false;
    for (size_t index = 0; (index < unitsCount()) && !unresolvedImports; ++index) {
        unresolvedImports = !units(index)->isResolved();
    }
    for (size_t index = 0; (index < componentCount()) && !unresolvedImports; ++index) {
        unresolvedImports = !component(index)->isResolved();
    }

    return unresolvedImports;
}